

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O2

mk_fifo_queue * mk_fifo_queue_get(mk_fifo *ctx,int id)

{
  mk_list *pmVar1;
  
  pmVar1 = &ctx->queues;
  do {
    pmVar1 = pmVar1->next;
    if (pmVar1 == &ctx->queues) {
      return (mk_fifo_queue *)0x0;
    }
  } while ((uint)*(ushort *)&pmVar1[-2].next != id);
  return (mk_fifo_queue *)&pmVar1[-2].next;
}

Assistant:

struct mk_fifo_queue *mk_fifo_queue_get(struct mk_fifo *ctx, int id)
{
    struct mk_list *head;
    struct mk_fifo_queue *q = NULL;

    mk_list_foreach(head, &ctx->queues) {
        q = mk_list_entry(head, struct mk_fifo_queue, _head);
        if (q->id == id) {
            return q;
        }
    }

    return NULL;
}